

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O1

void __thiscall S2Builder::Graph::VertexInMap::~VertexInMap(VertexInMap *this)

{
  pointer piVar1;
  
  piVar1 = (this->in_edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    return;
  }
  return;
}

Assistant:

VertexInMap() = default;